

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

void density::swap(consume_operation *i_first,consume_operation *i_second)

{
  consume_operation *i_second_local;
  consume_operation *i_first_local;
  
  std::swap<std::mutex>(&i_first->m_lock,&i_second->m_lock);
  std::
  swap<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::consume_operation>
            (&i_first->m_consume_operation,&i_second->m_consume_operation);
  return;
}

Assistant:

void swap(consume_operation & i_first, consume_operation & i_second) noexcept
            {
                std::swap(i_first.m_lock, i_second.m_lock);
                std::swap(i_first.m_consume_operation, i_second.m_consume_operation);
            }